

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
* TasGrid::IO::getStringRuleMap_abi_cxx11_(void)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>
  __l;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  *local_7c0;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>
  local_79e;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_79d;
  TypeOneDRule local_79c [46];
  TypeOneDRule local_6e4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  *local_6e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_6d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_6b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_688;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_660;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_638;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_610;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_5e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_5c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_598;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_570;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_548;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_520;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_4f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_4d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_4a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_480;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_458;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_408;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_3b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_390;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_340;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  local_48;
  iterator local_20;
  size_type local_18;
  
  local_6e0 = &local_6d8;
  local_6e4 = rule_none;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[5],_TasGrid::TypeOneDRule,_true>(local_6e0,(char (*) [5])"none",&local_6e4);
  local_6e0 = &local_6b0;
  local_79c[0x29] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[16],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [16])"clenshaw-curtis",local_79c + 0x29);
  local_6e0 = &local_688;
  local_79c[0x28] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[21],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [21])"clenshaw-curtis-zero",local_79c + 0x28);
  local_6e0 = &local_660;
  local_79c[0x27] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[10],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [10])"chebyshev",local_79c + 0x27);
  local_6e0 = &local_638;
  local_79c[0x26] = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [14])"chebyshev-odd",local_79c + 0x26);
  local_6e0 = &local_610;
  local_79c[0x25] = 0x15;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[15],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [15])"gauss-legendre",local_79c + 0x25);
  local_6e0 = &local_5e8;
  local_79c[0x24] = 0x16;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[19],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [19])"gauss-legendre-odd",local_79c + 0x24);
  local_6e0 = &local_5c0;
  local_79c[0x23] = 0x17;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[16],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [16])"gauss-patterson",local_79c + 0x23);
  local_6e0 = &local_598;
  local_79c[0x22] = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[5],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [5])0x1801a7,local_79c + 0x22);
  local_6e0 = &local_570;
  local_79c[0x21] = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[9],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [9])0x1801c9,local_79c + 0x21);
  local_6e0 = &local_548;
  local_79c[0x20] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[6],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [6])"rleja",local_79c + 0x20);
  local_6e0 = &local_520;
  local_79c[0x1f] = 9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [14])"rleja-double2",local_79c + 0x1f);
  local_6e0 = &local_4f8;
  local_79c[0x1e] = 10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [14])"rleja-double4",local_79c + 0x1e);
  local_6e0 = &local_4d0;
  local_79c[0x1d] = 0xb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[10],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [10])"rleja-odd",local_79c + 0x1d);
  local_6e0 = &local_4a8;
  local_79c[0x1c] = 0xc;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [14])"rleja-shifted",local_79c + 0x1c);
  local_6e0 = &local_480;
  local_79c[0x1b] = 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[19],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [19])"rleja-shifted-even",local_79c + 0x1b);
  local_6e0 = &local_458;
  local_79c[0x1a] = 0xe;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[21],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [21])"rleja-shifted-double",local_79c + 0x1a);
  local_6e0 = &local_430;
  local_79c[0x19] = 0xf;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[13],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [13])"max-lebesgue",local_79c + 0x19);
  local_6e0 = &local_408;
  local_79c[0x18] = 0x10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [17])"max-lebesgue-odd",local_79c + 0x18);
  local_6e0 = &local_3e0;
  local_79c[0x17] = 0x11;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[13],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [13])"min-lebesgue",local_79c + 0x17);
  local_6e0 = &local_3b8;
  local_79c[0x16] = 0x12;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [17])"min-lebesgue-odd",local_79c + 0x16);
  local_6e0 = &local_390;
  local_79c[0x15] = 0x13;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[10],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [10])"min-delta",local_79c + 0x15);
  local_6e0 = &local_368;
  local_79c[0x14] = 0x14;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [14])"min-delta-odd",local_79c + 0x14);
  local_6e0 = &local_340;
  local_79c[0x13] = 0x18;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [17])"gauss-chebyshev1",local_79c + 0x13);
  local_6e0 = &local_318;
  local_79c[0x12] = 0x19;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[21],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [21])"gauss-chebyshev1-odd",local_79c + 0x12);
  local_6e0 = &local_2f0;
  local_79c[0x11] = 0x1a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [17])"gauss-chebyshev2",local_79c + 0x11);
  local_6e0 = &local_2c8;
  local_79c[0x10] = 0x1b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[21],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [21])"gauss-chebyshev2-odd",local_79c + 0x10);
  local_6e0 = &local_2a0;
  local_79c[0xf] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[7],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [7])"fejer2",local_79c + 0xf);
  local_6e0 = &local_278;
  local_79c[0xe] = 0x1c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [17])"gauss-gegenbauer",local_79c + 0xe);
  local_6e0 = &local_250;
  local_79c[0xd] = 0x1d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[21],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [21])"gauss-gegenbauer-odd",local_79c + 0xd);
  local_6e0 = &local_228;
  local_79c[0xc] = 0x1e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[13],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [13])"gauss-jacobi",local_79c + 0xc);
  local_6e0 = &local_200;
  local_79c[0xb] = 0x1f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [17])"gauss-jacobi-odd",local_79c + 0xb);
  local_6e0 = &local_1d8;
  local_79c[10] = 0x20;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[15],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [15])"gauss-laguerre",local_79c + 10);
  local_6e0 = &local_1b0;
  local_79c[9] = 0x21;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[19],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [19])"gauss-laguerre-odd",local_79c + 9);
  local_6e0 = &local_188;
  local_79c[8] = 0x22;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[14],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [14])"gauss-hermite",local_79c + 8);
  local_6e0 = &local_160;
  local_79c[7] = 0x23;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[18],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [18])"gauss-hermite-odd",local_79c + 7);
  local_6e0 = &local_138;
  local_79c[6] = 0x24;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[17],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [17])"custom-tabulated",local_79c + 6);
  local_6e0 = &local_110;
  local_79c[5] = 0x25;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[7],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [7])0x180367,local_79c + 5);
  local_6e0 = &local_e8;
  local_79c[4] = 0x26;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[12],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [12])"localp-zero",local_79c + 4);
  local_6e0 = &local_c0;
  local_79c[3] = 0x28;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[16],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [16])"localp-boundary",local_79c + 3);
  local_6e0 = &local_98;
  local_79c[2] = 0x27;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[12],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [12])"semi-localp",local_79c + 2);
  local_6e0 = &local_70;
  local_79c[1] = 0x29;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[8],_TasGrid::TypeOneDRule,_true>
            (local_6e0,(char (*) [8])"wavelet",local_79c + 1);
  local_6e0 = &local_48;
  local_79c[0] = rule_fourier;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
  ::pair<const_char_(&)[8],_TasGrid::TypeOneDRule,_true>(local_6e0,(char (*) [8])0x17f928,local_79c)
  ;
  local_20 = &local_6d8;
  local_18 = 0x2b;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>
  ::allocator(&local_79e);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  ::map(in_RDI,__l,&local_79d,&local_79e);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>
  ::~allocator(&local_79e);
  local_7c0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
               *)&local_20;
  do {
    local_7c0 = local_7c0 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>
    ::~pair(local_7c0);
  } while (local_7c0 != &local_6d8);
  return in_RDI;
}

Assistant:

inline std::map<std::string, TypeOneDRule> getStringRuleMap(){
    return std::initializer_list<std::pair<std::string const, TypeOneDRule>>{
        {"none",                 rule_none},
        {"clenshaw-curtis",      rule_clenshawcurtis},
        {"clenshaw-curtis-zero", rule_clenshawcurtis0},
        {"chebyshev",            rule_chebyshev},
        {"chebyshev-odd",        rule_chebyshevodd},
        {"gauss-legendre",       rule_gausslegendre},
        {"gauss-legendre-odd",   rule_gausslegendreodd},
        {"gauss-patterson",      rule_gausspatterson},
        {"leja",                 rule_leja},
        {"leja-odd",             rule_lejaodd},
        {"rleja",                rule_rleja},
        {"rleja-double2",        rule_rlejadouble2},
        {"rleja-double4",        rule_rlejadouble4},
        {"rleja-odd",            rule_rlejaodd},
        {"rleja-shifted",        rule_rlejashifted},
        {"rleja-shifted-even",   rule_rlejashiftedeven},
        {"rleja-shifted-double", rule_rlejashifteddouble},
        {"max-lebesgue",         rule_maxlebesgue},
        {"max-lebesgue-odd",     rule_maxlebesgueodd},
        {"min-lebesgue",         rule_minlebesgue},
        {"min-lebesgue-odd",     rule_minlebesgueodd},
        {"min-delta",            rule_mindelta},
        {"min-delta-odd",        rule_mindeltaodd},
        {"gauss-chebyshev1",     rule_gausschebyshev1},
        {"gauss-chebyshev1-odd", rule_gausschebyshev1odd},
        {"gauss-chebyshev2",     rule_gausschebyshev2},
        {"gauss-chebyshev2-odd", rule_gausschebyshev2odd},
        {"fejer2",               rule_fejer2},
        {"gauss-gegenbauer",     rule_gaussgegenbauer},
        {"gauss-gegenbauer-odd", rule_gaussgegenbauerodd},
        {"gauss-jacobi",         rule_gaussjacobi},
        {"gauss-jacobi-odd",     rule_gaussjacobiodd},
        {"gauss-laguerre",       rule_gausslaguerre},
        {"gauss-laguerre-odd",   rule_gausslaguerreodd},
        {"gauss-hermite",        rule_gausshermite},
        {"gauss-hermite-odd",    rule_gausshermiteodd},
        {"custom-tabulated",     rule_customtabulated},
        {"localp",               rule_localp},
        {"localp-zero",          rule_localp0},
        {"localp-boundary",      rule_localpb},
        {"semi-localp",          rule_semilocalp},
        {"wavelet",              rule_wavelet},
        {"fourier",              rule_fourier}};
}